

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_add(secp256k1_fe *r,secp256k1_fe *a)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  secp256k1_fe *psVar5;
  int64_t iVar6;
  int64_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t *puVar11;
  secp256k1_fe *psVar12;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong extraout_RAX_07;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  uint uVar16;
  secp256k1_fe *psVar17;
  secp256k1_fe *psVar18;
  secp256k1_modinv64_signed62 *psVar19;
  uint uVar20;
  ulong *extraout_RDX;
  secp256k1_fe *psVar21;
  long lVar22;
  long lVar23;
  uint64_t uVar24;
  secp256k1_fe *psVar25;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  secp256k1_modinv64_signed62 *a_00;
  long *extraout_RDX_09;
  long lVar26;
  long lVar27;
  secp256k1_modinv64_signed62 *b;
  secp256k1_fe *psVar28;
  secp256k1_fe *unaff_RBP;
  secp256k1_fe *psVar29;
  ulong uVar30;
  secp256k1_modinv64_signed62 *psVar31;
  secp256k1_fe *a_01;
  secp256k1_modinv64_signed62 *a_02;
  secp256k1_fe *psVar32;
  secp256k1_fe *psVar33;
  undefined1 *puVar34;
  secp256k1_fe *psVar35;
  secp256k1_fe *psVar36;
  secp256k1_fe *unaff_R12;
  secp256k1_fe *psVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  bool bVar41;
  secp256k1_modinv64_signed62 sStack_258;
  secp256k1_modinv64_signed62 sStack_230;
  secp256k1_fe *psStack_208;
  secp256k1_fe *psStack_200;
  secp256k1_fe *psStack_1f8;
  ulong uStack_1f0;
  secp256k1_fe *psStack_1e8;
  ulong uStack_1e0;
  secp256k1_fe *psStack_1d8;
  secp256k1_fe *psStack_1d0;
  secp256k1_fe *psStack_1c8;
  uint64_t uStack_1c0;
  uint64_t uStack_1b8;
  secp256k1_fe *psStack_1b0;
  uint64_t uStack_1a8;
  uint64_t uStack_1a0;
  uint64_t uStack_198;
  uint64_t uStack_190;
  uint64_t uStack_188;
  secp256k1_fe *psStack_180;
  secp256k1_fe *psStack_178;
  secp256k1_fe *psStack_170;
  secp256k1_fe *psStack_168;
  secp256k1_fe *psStack_160;
  long lStack_158;
  secp256k1_fe *psStack_150;
  code *pcStack_148;
  undefined8 uStack_140;
  ulong uStack_138;
  secp256k1_fe sStack_130;
  secp256k1_fe *apsStack_100 [2];
  secp256k1_fe sStack_f0;
  secp256k1_modinv64_trans2x2 sStack_c0;
  secp256k1_fe sStack_a0;
  secp256k1_modinv64_signed62 sStack_70;
  secp256k1_fe *psStack_48;
  
  psVar28 = a;
  secp256k1_fe_verify(r);
  psVar21 = a;
  secp256k1_fe_verify(a);
  iVar4 = a->magnitude + r->magnitude;
  if (iVar4 < 0x21) {
    r->n[0] = r->n[0] + a->n[0];
    r->n[1] = r->n[1] + a->n[1];
    r->n[2] = r->n[2] + a->n[2];
    r->n[3] = r->n[3] + a->n[3];
    r->n[4] = r->n[4] + a->n[4];
    r->magnitude = iVar4;
    r->normalized = 0;
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_add_cold_1();
  sStack_a0.n[2] = 0;
  sStack_a0.n[3] = 0;
  sStack_a0.n[0] = 0;
  sStack_a0.n[1] = 0;
  sStack_a0.n[4] = 0;
  sStack_70.v[3] = 0;
  sStack_70.v[4] = 0;
  sStack_70.v[1] = 0;
  sStack_70.v[2] = 0;
  sStack_70.v[0] = 1;
  sStack_130.n[4] = psVar28->n[4];
  sStack_130.n[0] = psVar28->n[0];
  sStack_130.n[1] = psVar28->n[1];
  sStack_130.n[2] = psVar28->n[2];
  sStack_130.n[3] = psVar28->n[3];
  sStack_f0.n[4] = psVar21->n[4];
  sStack_f0.n[0] = psVar21->n[0];
  sStack_f0.n[1] = psVar21->n[1];
  sStack_f0.n[2] = psVar21->n[2];
  sStack_f0.n[3] = psVar21->n[3];
  uStack_138 = 0;
  lVar40 = -1;
  uStack_140._4_4_ = 5;
  apsStack_100[0] = psVar21;
  apsStack_100[1] = psVar28;
  psStack_48 = r;
LAB_00140a4d:
  psVar18 = apsStack_100[1];
  psVar28 = (secp256k1_fe *)sStack_130.n[0];
  psVar5 = (secp256k1_fe *)0x0;
  psVar33 = (secp256k1_fe *)0x0;
  psVar32 = (secp256k1_fe *)0x1;
  uVar20 = 0x3e;
  psVar29 = (secp256k1_fe *)0x1;
  puVar34 = (undefined1 *)sStack_f0.n[0];
  psVar21 = (secp256k1_fe *)sStack_130.n[0];
  while( true ) {
    a_01 = (secp256k1_fe *)(-1L << ((byte)uVar20 & 0x3f) | (ulong)puVar34);
    psVar17 = (secp256k1_fe *)0x0;
    if (a_01 != (secp256k1_fe *)0x0) {
      for (; ((ulong)a_01 >> (long)psVar17 & 1) == 0;
          psVar17 = (secp256k1_fe *)((long)psVar17->n + 1)) {
      }
    }
    bVar15 = (byte)psVar17;
    psVar35 = (secp256k1_fe *)((ulong)puVar34 >> (bVar15 & 0x3f));
    psVar29 = (secp256k1_fe *)((long)psVar29 << (bVar15 & 0x3f));
    psVar5 = (secp256k1_fe *)((long)psVar5 << (bVar15 & 0x3f));
    lVar40 = lVar40 - (long)psVar17;
    uVar20 = uVar20 - (int)psVar17;
    if (uVar20 == 0) break;
    if (((ulong)psVar21 & 1) == 0) {
      pcStack_148 = (code *)0x140ee7;
      secp256k1_modinv64_var_cold_8();
LAB_00140ee7:
      pcStack_148 = (code *)0x140eec;
      secp256k1_modinv64_var_cold_7();
LAB_00140eec:
      pcStack_148 = (code *)0x140ef1;
      secp256k1_modinv64_var_cold_1();
LAB_00140ef1:
      pcStack_148 = (code *)0x140ef6;
      secp256k1_modinv64_var_cold_2();
LAB_00140ef6:
      pcStack_148 = (code *)0x140efb;
      secp256k1_modinv64_var_cold_6();
      psVar35 = psVar21;
      goto LAB_00140efb;
    }
    if (((ulong)psVar35 & 1) == 0) goto LAB_00140ee7;
    a_01 = (secp256k1_fe *)((long)psVar5 * sStack_f0.n[0] + (long)psVar29 * sStack_130.n[0]);
    psVar17 = (secp256k1_fe *)(ulong)(0x3e - uVar20);
    bVar15 = (byte)(0x3e - uVar20);
    r = (secp256k1_fe *)((long)psVar21 << (bVar15 & 0x3f));
    if (a_01 != r) goto LAB_00140eec;
    r = (secp256k1_fe *)((long)psVar32 * sStack_f0.n[0] + (long)psVar33 * sStack_130.n[0]);
    a_01 = (secp256k1_fe *)((long)psVar35 << (bVar15 & 0x3f));
    if (r != a_01) goto LAB_00140ef1;
    psVar17 = (secp256k1_fe *)(lVar40 - 0x2ea);
    if (psVar17 < (secp256k1_fe *)0xfffffffffffffa2d) goto LAB_00140ef6;
    iVar4 = (int)psVar35;
    if (lVar40 < 0) {
      lVar40 = -lVar40;
      uVar16 = (int)lVar40 + 1;
      if ((int)uVar20 <= (int)uVar16) {
        uVar16 = uVar20;
      }
      psVar17 = (secp256k1_fe *)(ulong)uVar16;
      a_01 = (secp256k1_fe *)(ulong)(uVar16 - 0x3f);
      if (0xffffffc1 < uVar16 - 0x3f) {
        psVar12 = (secp256k1_fe *)-(long)psVar5;
        unaff_RBP = (secp256k1_fe *)-(long)psVar29;
        psVar17 = (secp256k1_fe *)-(long)psVar21;
        r = (secp256k1_fe *)((ulong)(0x3fL << (-(char)uVar16 & 0x3fU)) >> (-(char)uVar16 & 0x3fU));
        uVar16 = (iVar4 * iVar4 + 0x3e) * iVar4 * (int)psVar17 & (uint)r;
        psVar5 = psVar32;
        psVar29 = psVar33;
        unaff_R12 = psVar12;
        goto LAB_00140ba9;
      }
      goto LAB_00140f05;
    }
    uVar16 = (int)lVar40 + 1;
    if ((int)uVar20 <= (int)uVar16) {
      uVar16 = uVar20;
    }
    psVar17 = (secp256k1_fe *)(ulong)uVar16;
    a_01 = (secp256k1_fe *)(ulong)(uVar16 - 0x3f);
    if (uVar16 - 0x3f < 0xffffffc2) goto LAB_00140f00;
    r = (secp256k1_fe *)((ulong)(0xfL << (-(char)uVar16 & 0x3fU)) >> (-(char)uVar16 & 0x3fU));
    uVar16 = -(iVar4 * (((int)psVar21 * 2 + 2U & 8) + (int)psVar21)) & (uint)r;
    unaff_RBP = psVar33;
    psVar12 = psVar32;
    psVar17 = psVar35;
    psVar35 = psVar21;
LAB_00140ba9:
    uVar30 = (ulong)uVar16;
    a_01 = (secp256k1_fe *)(uVar30 * (long)psVar35);
    puVar34 = (undefined1 *)((long)a_01->n + (long)psVar17->n);
    psVar33 = (secp256k1_fe *)((long)unaff_RBP->n + (long)psVar29 * uVar30);
    psVar17 = (secp256k1_fe *)(uVar30 * (long)psVar5);
    psVar32 = (secp256k1_fe *)((long)psVar17->n + (long)psVar12->n);
    psVar21 = psVar35;
    if (((ulong)puVar34 & (ulong)r) != 0) {
LAB_00140efb:
      pcStack_148 = (code *)0x140f00;
      secp256k1_modinv64_var_cold_4();
      psVar21 = psVar35;
LAB_00140f00:
      pcStack_148 = (code *)0x140f05;
      secp256k1_modinv64_var_cold_3();
LAB_00140f05:
      pcStack_148 = (code *)0x140f0a;
      secp256k1_modinv64_var_cold_5();
      psVar18 = unaff_R12;
      goto LAB_00140f0a;
    }
  }
  a_01 = (secp256k1_fe *)((long)psVar5 * (long)psVar33);
  psVar17 = SUB168(SEXT816((long)psVar5) * SEXT816((long)psVar33),8);
  sStack_c0.u = (int64_t)psVar29;
  sStack_c0.v = (int64_t)psVar5;
  sStack_c0.q = (int64_t)psVar33;
  sStack_c0.r = (int64_t)psVar32;
  if ((long)psVar29 * (long)psVar32 - (long)a_01 != 0x4000000000000000 ||
      SUB168(SEXT816((long)psVar29) * SEXT816((long)psVar32),8) - (long)psVar17 !=
      (ulong)((secp256k1_fe *)((long)psVar29 * (long)psVar32) < a_01)) goto LAB_00140f41;
  pcStack_148 = (code *)0x140c37;
  secp256k1_modinv64_update_de_62
            ((secp256k1_modinv64_signed62 *)&sStack_a0,&sStack_70,&sStack_c0,
             (secp256k1_modinv64_modinfo *)apsStack_100[1]);
  uVar20 = uStack_140._4_4_;
  psVar28 = &sStack_130;
  r = (secp256k1_fe *)(ulong)uStack_140._4_4_;
  psVar29 = (secp256k1_fe *)(ulong)uStack_140._4_4_;
  psVar17 = (secp256k1_fe *)0xffffffffffffffff;
  pcStack_148 = (code *)0x140c54;
  a_01 = psVar28;
  iVar4 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar28,uStack_140._4_4_,
                     (secp256k1_modinv64_signed62 *)psVar18,-1);
  psVar21 = &sStack_f0;
  if (0 < iVar4) {
    psVar17 = (secp256k1_fe *)0x1;
    psVar29 = (secp256k1_fe *)(ulong)uVar20;
    pcStack_148 = (code *)0x140c73;
    a_01 = psVar28;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar28,uVar20,
                       (secp256k1_modinv64_signed62 *)psVar18,1);
    if (0 < iVar4) goto LAB_00140f0f;
    psVar29 = (secp256k1_fe *)(ulong)uVar20;
    psVar17 = (secp256k1_fe *)0xffffffffffffffff;
    pcStack_148 = (code *)0x140c8f;
    a_01 = psVar21;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar21,uVar20,
                       (secp256k1_modinv64_signed62 *)psVar18,-1);
    if (iVar4 < 1) goto LAB_00140f14;
    psVar17 = (secp256k1_fe *)0x1;
    psVar29 = (secp256k1_fe *)(ulong)uVar20;
    pcStack_148 = (code *)0x140ca9;
    a_01 = psVar21;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar21,uVar20,
                       (secp256k1_modinv64_signed62 *)psVar18,1);
    if (-1 < iVar4) goto LAB_00140f19;
    pcStack_148 = (code *)0x140cc6;
    secp256k1_modinv64_update_fg_62_var
              (uVar20,(secp256k1_modinv64_signed62 *)psVar28,(secp256k1_modinv64_signed62 *)psVar21,
               &sStack_c0);
    if ((undefined1 *)sStack_f0.n[0] == (undefined1 *)0x0) {
      if (1 < (int)uVar20) {
        uVar30 = 1;
        uVar8 = 0;
        do {
          uVar8 = uVar8 | sStack_f0.n[uVar30];
          uVar30 = uVar30 + 1;
        } while (uVar20 != uVar30);
        if (uVar8 != 0) goto LAB_00140cf6;
      }
      a_01 = &sStack_f0;
      psVar29 = (secp256k1_fe *)(ulong)uVar20;
      psVar17 = (secp256k1_fe *)0x0;
      pcStack_148 = (code *)0x140ddb;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)a_01,uVar20,&SECP256K1_SIGNED62_ONE,0);
      if (iVar4 != 0) goto LAB_00140f37;
      pcStack_148 = (code *)0x140dfd;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)&sStack_130,uVar20,&SECP256K1_SIGNED62_ONE,
                         -1);
      psVar28 = apsStack_100[0];
      if (iVar4 != 0) {
        pcStack_148 = (code *)0x140e22;
        iVar4 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)&sStack_130,uVar20,&SECP256K1_SIGNED62_ONE
                           ,1);
        if (iVar4 != 0) {
          psVar29 = (secp256k1_fe *)0x5;
          psVar17 = (secp256k1_fe *)0x0;
          pcStack_148 = (code *)0x140e3c;
          a_01 = psVar28;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar28,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar4 != 0) goto LAB_00140f3c;
          a_01 = &sStack_a0;
          psVar29 = (secp256k1_fe *)0x5;
          psVar17 = (secp256k1_fe *)0x0;
          pcStack_148 = (code *)0x140e5f;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)a_01,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar4 != 0) goto LAB_00140f3c;
          pcStack_148 = (code *)0x140e7b;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)&sStack_130,uVar20,
                             (secp256k1_modinv64_signed62 *)psVar18,1);
          if (iVar4 != 0) {
            a_01 = &sStack_130;
            psVar29 = (secp256k1_fe *)(ulong)uVar20;
            psVar17 = (secp256k1_fe *)0xffffffffffffffff;
            pcStack_148 = (code *)0x140e95;
            iVar4 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)a_01,uVar20,
                               (secp256k1_modinv64_signed62 *)psVar18,-1);
            if (iVar4 != 0) goto LAB_00140f3c;
          }
        }
      }
      pcStack_148 = (code *)0x140eb8;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)&sStack_a0,(&uStack_138)[(int)uVar20],
                 (secp256k1_modinv64_modinfo *)psVar18);
      psVar28->n[4] = sStack_a0.n[4];
      psVar28->n[2] = sStack_a0.n[2];
      psVar28->n[3] = sStack_a0.n[3];
      psVar28->n[0] = sStack_a0.n[0];
      psVar28->n[1] = sStack_a0.n[1];
      return;
    }
LAB_00140cf6:
    lVar22 = (long)(int)uVar20;
    uVar30 = (&uStack_138)[lVar22];
    psVar17 = apsStack_100[lVar22 + 1];
    a_01 = (secp256k1_fe *)((long)uVar30 >> 0x3f ^ uVar30 | lVar22 + -2 >> 0x3f);
    psVar29 = (secp256k1_fe *)((long)psVar17 >> 0x3f ^ (ulong)psVar17 | (ulong)a_01);
    if (psVar29 == (secp256k1_fe *)0x0) {
      r = (secp256k1_fe *)(ulong)(uVar20 - 1);
      (&uStack_140)[lVar22] = (&uStack_140)[lVar22] | uVar30 << 0x3e;
      psVar17 = (secp256k1_fe *)((long)psVar17 << 0x3e);
      apsStack_100[lVar22] = (secp256k1_fe *)((ulong)apsStack_100[lVar22] | (ulong)psVar17);
    }
    if ((int)uStack_138 == 0xb) goto LAB_00140f1e;
    uVar20 = (uint)r;
    psVar17 = (secp256k1_fe *)0xffffffffffffffff;
    pcStack_148 = (code *)0x140d59;
    psVar29 = r;
    a_01 = psVar28;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar28,uVar20,
                       (secp256k1_modinv64_signed62 *)psVar18,-1);
    if (iVar4 < 1) goto LAB_00140f23;
    psVar17 = (secp256k1_fe *)0x1;
    pcStack_148 = (code *)0x140d73;
    psVar29 = r;
    a_01 = psVar28;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar28,uVar20,
                       (secp256k1_modinv64_signed62 *)psVar18,1);
    if (0 < iVar4) goto LAB_00140f28;
    psVar17 = (secp256k1_fe *)0xffffffffffffffff;
    pcStack_148 = (code *)0x140d8f;
    psVar29 = r;
    a_01 = psVar21;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar21,uVar20,
                       (secp256k1_modinv64_signed62 *)psVar18,-1);
    if (iVar4 < 1) goto LAB_00140f2d;
    psVar17 = (secp256k1_fe *)0x1;
    pcStack_148 = (code *)0x140da9;
    psVar29 = r;
    a_01 = psVar21;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar21,uVar20,
                       (secp256k1_modinv64_signed62 *)psVar18,1);
    if (-1 < iVar4) goto LAB_00140f32;
    uStack_138 = (ulong)((int)uStack_138 + 1);
    unaff_R12 = psVar18;
    uStack_140._4_4_ = uVar20;
    goto LAB_00140a4d;
  }
LAB_00140f0a:
  pcStack_148 = (code *)0x140f0f;
  secp256k1_modinv64_var_cold_20();
LAB_00140f0f:
  pcStack_148 = (code *)0x140f14;
  secp256k1_modinv64_var_cold_19();
LAB_00140f14:
  pcStack_148 = (code *)0x140f19;
  secp256k1_modinv64_var_cold_18();
LAB_00140f19:
  pcStack_148 = (code *)0x140f1e;
  secp256k1_modinv64_var_cold_17();
LAB_00140f1e:
  pcStack_148 = (code *)0x140f23;
  secp256k1_modinv64_var_cold_14();
LAB_00140f23:
  pcStack_148 = (code *)0x140f28;
  secp256k1_modinv64_var_cold_13();
LAB_00140f28:
  pcStack_148 = (code *)0x140f2d;
  secp256k1_modinv64_var_cold_12();
LAB_00140f2d:
  pcStack_148 = (code *)0x140f32;
  secp256k1_modinv64_var_cold_11();
LAB_00140f32:
  pcStack_148 = (code *)0x140f37;
  secp256k1_modinv64_var_cold_10();
LAB_00140f37:
  pcStack_148 = (code *)0x140f3c;
  secp256k1_modinv64_var_cold_15();
LAB_00140f3c:
  pcStack_148 = (code *)0x140f41;
  secp256k1_modinv64_var_cold_16();
  unaff_R12 = psVar18;
LAB_00140f41:
  pcStack_148 = secp256k1_scalar_from_signed62;
  secp256k1_modinv64_var_cold_9();
  puVar11 = psVar29->n;
  if (*puVar11 >> 0x3e == 0) {
    uVar30 = psVar29->n[1];
    if (0x3fffffffffffffff < uVar30) goto LAB_00140fd0;
    psVar17 = (secp256k1_fe *)psVar29->n[2];
    if ((secp256k1_fe *)0x3fffffffffffffff < psVar17) goto LAB_00140fd5;
    uVar8 = psVar29->n[3];
    if (0x3fffffffffffffff < uVar8) goto LAB_00140fda;
    psVar29 = (secp256k1_fe *)psVar29->n[4];
    if (psVar29 < (secp256k1_fe *)&DAT_00000100) {
      a_01->n[0] = uVar30 << 0x3e | *puVar11;
      a_01->n[1] = (long)psVar17 << 0x3c | uVar30 >> 2;
      a_01->n[2] = uVar8 << 0x3a | (ulong)psVar17 >> 4;
      a_01->n[3] = (long)psVar29 << 0x38 | uVar8 >> 6;
      secp256k1_scalar_verify((secp256k1_scalar *)a_01);
      return;
    }
  }
  else {
    psStack_150 = (secp256k1_fe *)0x140fd0;
    secp256k1_scalar_from_signed62_cold_5();
LAB_00140fd0:
    psStack_150 = (secp256k1_fe *)0x140fd5;
    secp256k1_scalar_from_signed62_cold_4();
LAB_00140fd5:
    psStack_150 = (secp256k1_fe *)0x140fda;
    secp256k1_scalar_from_signed62_cold_3();
LAB_00140fda:
    psStack_150 = (secp256k1_fe *)0x140fdf;
    secp256k1_scalar_from_signed62_cold_2();
  }
  psStack_150 = (secp256k1_fe *)secp256k1_modinv64_update_de_62;
  secp256k1_scalar_from_signed62_cold_1();
  psStack_150 = unaff_RBP;
  lStack_158 = lVar40;
  psStack_160 = psVar28;
  psStack_168 = psVar21;
  psStack_170 = unaff_R12;
  psStack_178 = r;
  uVar24 = a_01->n[0];
  uStack_198 = a_01->n[1];
  uStack_1a0 = a_01->n[2];
  uStack_1a8 = a_01->n[3];
  uStack_1b8 = a_01->n[4];
  uVar1 = psVar29->n[0];
  psStack_180 = (secp256k1_fe *)psVar29->n[1];
  uVar2 = psVar29->n[2];
  uStack_1e0 = *extraout_RDX;
  psStack_1d8 = (secp256k1_fe *)extraout_RDX[1];
  uStack_1f0 = extraout_RDX[2];
  psStack_1e8 = (secp256k1_fe *)extraout_RDX[3];
  uStack_188 = psVar29->n[3];
  uStack_1c0 = psVar29->n[4];
  uVar30 = 5;
  psVar18 = (secp256k1_fe *)0xfffffffffffffffe;
  psStack_1f8 = (secp256k1_fe *)0x14107a;
  psVar21 = a_01;
  iVar4 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)a_01,5,(secp256k1_modinv64_signed62 *)psVar17,-2
                    );
  psVar28 = psVar29;
  if (iVar4 < 1) {
LAB_00141b1f:
    psStack_1f8 = (secp256k1_fe *)0x141b24;
    secp256k1_modinv64_update_de_62_cold_34();
LAB_00141b24:
    psStack_1f8 = (secp256k1_fe *)0x141b29;
    secp256k1_modinv64_update_de_62_cold_33();
LAB_00141b29:
    psStack_1f8 = (secp256k1_fe *)0x141b2e;
    secp256k1_modinv64_update_de_62_cold_32();
LAB_00141b2e:
    psStack_1f8 = (secp256k1_fe *)0x141b33;
    secp256k1_modinv64_update_de_62_cold_31();
LAB_00141b33:
    psStack_1f8 = (secp256k1_fe *)0x141b38;
    secp256k1_modinv64_update_de_62_cold_30();
    psVar29 = psVar17;
LAB_00141b38:
    psStack_1f8 = (secp256k1_fe *)0x141b3d;
    secp256k1_modinv64_update_de_62_cold_29();
LAB_00141b3d:
    psStack_1f8 = (secp256k1_fe *)0x141b42;
    secp256k1_modinv64_update_de_62_cold_1();
    psVar17 = psVar29;
LAB_00141b42:
    psStack_1f8 = (secp256k1_fe *)0x141b47;
    secp256k1_modinv64_update_de_62_cold_2();
LAB_00141b47:
    psStack_1f8 = (secp256k1_fe *)0x141b4c;
    secp256k1_modinv64_update_de_62_cold_19();
LAB_00141b4c:
    psStack_1f8 = (secp256k1_fe *)0x141b51;
    secp256k1_modinv64_update_de_62_cold_17();
LAB_00141b51:
    psStack_1f8 = (secp256k1_fe *)0x141b56;
    secp256k1_modinv64_update_de_62_cold_14();
LAB_00141b56:
    psStack_1f8 = (secp256k1_fe *)0x141b5b;
    secp256k1_modinv64_update_de_62_cold_13();
LAB_00141b5b:
    psVar32 = psVar21;
    psStack_1f8 = (secp256k1_fe *)0x141b60;
    secp256k1_modinv64_update_de_62_cold_12();
LAB_00141b60:
    psStack_1f8 = (secp256k1_fe *)0x141b65;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_00141b65:
    psStack_1f8 = (secp256k1_fe *)0x141b6a;
    secp256k1_modinv64_update_de_62_cold_10();
LAB_00141b6a:
    psStack_1f8 = (secp256k1_fe *)0x141b6f;
    secp256k1_modinv64_update_de_62_cold_9();
    psVar21 = psVar32;
LAB_00141b6f:
    psStack_1f8 = (secp256k1_fe *)0x141b74;
    secp256k1_modinv64_update_de_62_cold_28();
  }
  else {
    psVar18 = (secp256k1_fe *)0x1;
    uVar30 = 5;
    psStack_1f8 = (secp256k1_fe *)0x14109c;
    psVar21 = a_01;
    psStack_1b0 = a_01;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)a_01,5,(secp256k1_modinv64_signed62 *)psVar17,
                       1);
    if (-1 < iVar4) goto LAB_00141b24;
    uVar30 = 5;
    psVar18 = (secp256k1_fe *)0xfffffffffffffffe;
    psStack_1f8 = (secp256k1_fe *)0x1410bb;
    psVar21 = psVar29;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar29,5,
                       (secp256k1_modinv64_signed62 *)psVar17,-2);
    if (iVar4 < 1) goto LAB_00141b29;
    psVar18 = (secp256k1_fe *)0x1;
    uVar30 = 5;
    psStack_1f8 = (secp256k1_fe *)0x1410d8;
    psVar21 = psVar29;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar29,5,
                       (secp256k1_modinv64_signed62 *)psVar17,1);
    if (-1 < iVar4) goto LAB_00141b2e;
    psVar28 = (secp256k1_fe *)0x3fffffffffffffff;
    psStack_1f8 = (secp256k1_fe *)0x1410fe;
    psStack_1c8 = psVar29;
    uStack_190 = uVar2;
    iVar6 = secp256k1_modinv64_abs(uStack_1e0);
    psStack_1f8 = (secp256k1_fe *)0x14110b;
    psVar21 = psStack_1d8;
    iVar7 = secp256k1_modinv64_abs((int64_t)psStack_1d8);
    psVar18 = (secp256k1_fe *)(0x4000000000000000 - iVar7);
    if ((long)psVar18 < iVar6) goto LAB_00141b33;
    psStack_1f8 = (secp256k1_fe *)0x141126;
    iVar6 = secp256k1_modinv64_abs(uStack_1f0);
    psStack_1f8 = (secp256k1_fe *)0x141133;
    psVar21 = psStack_1e8;
    iVar7 = secp256k1_modinv64_abs((int64_t)psStack_1e8);
    psVar18 = (secp256k1_fe *)(0x4000000000000000 - iVar7);
    psVar29 = psVar17;
    if ((long)psVar18 < iVar6) goto LAB_00141b38;
    uVar30 = uStack_1e0 * uVar24;
    psVar18 = SUB168(SEXT816((long)uStack_1e0) * SEXT816((long)uVar24),8);
    uVar8 = (long)psStack_1d8 * uVar1;
    psVar21 = SUB168(SEXT816((long)psStack_1d8) * SEXT816((long)uVar1),8);
    a_01 = (secp256k1_fe *)0x7fffffffffffffff;
    lVar40 = (0x7fffffffffffffff - (long)psVar21) - (long)psVar18;
    if ((SBORROW8(0x7fffffffffffffff - (long)psVar21,(long)psVar18) !=
        SBORROW8(lVar40,(ulong)(~uVar8 < uVar30))) != (long)(lVar40 - (ulong)(~uVar8 < uVar30)) < 0
        && -1 < (long)psVar21) goto LAB_00141b6f;
    psVar5 = (secp256k1_fe *)(uVar8 + uVar30);
    psVar21 = (secp256k1_fe *)((long)psVar18->n + (ulong)CARRY8(uVar8,uVar30) + (long)psVar21->n);
    uVar9 = uStack_1f0 * uVar24;
    lVar22 = SUB168(SEXT816((long)uStack_1f0) * SEXT816((long)uVar24),8);
    uVar10 = (long)psStack_1e8 * uVar1;
    lVar23 = SUB168(SEXT816((long)psStack_1e8) * SEXT816((long)uVar1),8);
    uVar8 = (ulong)(-uVar10 - 1 < uVar9);
    lVar40 = (0x7fffffffffffffff - lVar23) - lVar22;
    bVar41 = (SBORROW8(0x7fffffffffffffff - lVar23,lVar22) != SBORROW8(lVar40,uVar8)) !=
             (long)(lVar40 - uVar8) < 0;
    psVar18 = (secp256k1_fe *)CONCAT71((int7)(-uVar10 - 1 >> 8),bVar41 && -1 < lVar23);
    if (!bVar41 || -1 >= lVar23) {
      psVar29 = (secp256k1_fe *)((long)uStack_1b8 >> 0x3f);
      psVar18 = (secp256k1_fe *)((long)uStack_1c0 >> 0x3f);
      lVar40 = ((ulong)psStack_1d8 & (ulong)psVar18) + (uStack_1e0 & (ulong)psVar29);
      psVar33 = (secp256k1_fe *)(uVar10 + uVar9);
      lVar22 = lVar23 + lVar22 + (ulong)CARRY8(uVar10,uVar9);
      uVar24 = psVar17->n[0];
      uVar8 = *(ulong *)&psVar17->magnitude;
      uVar30 = lVar40 - (uVar8 * (long)psVar5 + lVar40 & 0x3fffffffffffffff);
      puVar11 = (uint64_t *)(uVar30 * uVar24);
      psVar32 = SUB168(SEXT816((long)uVar30) * SEXT816((long)uVar24),8);
      psStack_1d0 = psVar17;
      if (-1 < (long)psVar32) {
        uVar9 = (ulong)((secp256k1_fe *)(-(long)puVar11 - 1U) < psVar5);
        lVar40 = (0x7fffffffffffffff - (long)psVar32) - (long)psVar21;
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar32,(long)psVar21) != SBORROW8(lVar40,uVar9))
            == (long)(lVar40 - uVar9) < 0) goto LAB_00141261;
LAB_00141422:
        psStack_1f8 = (secp256k1_fe *)0x141427;
        secp256k1_modinv64_update_de_62_cold_26();
LAB_00141427:
        lVar23 = (-0x8000000000000000 - uVar24) - (ulong)(uVar8 != 0);
        lVar40 = lVar22 - lVar23;
        if ((SBORROW8(lVar22,lVar23) != SBORROW8(lVar40,(ulong)(psVar33 < (secp256k1_fe *)-uVar8)))
            == (long)(lVar40 - (ulong)(psVar33 < (secp256k1_fe *)-uVar8)) < 0) goto LAB_001412b1;
LAB_00141449:
        psStack_1f8 = (secp256k1_fe *)0x14144e;
        secp256k1_modinv64_update_de_62_cold_25();
        uVar9 = extraout_RAX;
        lVar40 = extraout_RDX_00;
LAB_0014144e:
        psVar29 = (secp256k1_fe *)((-0x8000000000000000 - lVar40) - (ulong)(uVar9 != 0));
        psVar21 = (secp256k1_fe *)
                  (((long)psVar5 - (long)psVar29) - (ulong)(psVar33 < (secp256k1_fe *)-uVar9));
        if ((SBORROW8((long)psVar5,(long)psVar29) !=
            SBORROW8((long)psVar5 - (long)psVar29,(ulong)(psVar33 < (secp256k1_fe *)-uVar9))) ==
            (long)psVar21 < 0) {
LAB_00141334:
          uVar8 = uVar8 >> 0x3e | uVar24 << 2;
          bVar41 = CARRY8((ulong)psVar33,uVar9);
          psVar33 = (secp256k1_fe *)((long)psVar33->n + uVar9);
          psVar5 = (secp256k1_fe *)((long)psVar5->n + (ulong)bVar41 + lVar40);
          psVar29 = (secp256k1_fe *)(uStack_1f0 * uStack_198 + uVar8);
          psVar21 = (secp256k1_fe *)
                    (SUB168(SEXT816((long)uStack_1f0) * SEXT816((long)uStack_198),8) +
                     ((long)uVar24 >> 0x3e) + (ulong)CARRY8(uStack_1f0 * uStack_198,uVar8));
          uVar8 = (long)psStack_1e8 * (long)psVar32;
          lVar40 = SUB168(SEXT816((long)psStack_1e8) * SEXT816((long)psVar32),8);
          if (lVar40 < 0) goto LAB_00141478;
          uVar9 = (ulong)((secp256k1_fe *)(-1 - uVar8) < psVar29);
          lVar22 = (0x7fffffffffffffff - lVar40) - (long)psVar21;
          psVar17 = (secp256k1_fe *)(lVar22 - uVar9);
          if ((SBORROW8(0x7fffffffffffffff - lVar40,(long)psVar21) != SBORROW8(lVar22,uVar9)) !=
              (long)psVar17 < 0) goto LAB_00141490;
        }
        else {
LAB_00141473:
          psStack_1f8 = (secp256k1_fe *)0x141478;
          secp256k1_modinv64_update_de_62_cold_24();
          uVar8 = extraout_RAX_00;
          lVar40 = extraout_RDX_01;
LAB_00141478:
          psVar17 = (secp256k1_fe *)((-0x8000000000000000 - lVar40) - (ulong)(uVar8 != 0));
          if ((SBORROW8((long)psVar21,(long)psVar17) !=
              SBORROW8((long)psVar21 - (long)psVar17,(ulong)(psVar29 < (secp256k1_fe *)-uVar8))) !=
              (long)(((long)psVar21 - (long)psVar17) - (ulong)(psVar29 < (secp256k1_fe *)-uVar8)) <
              0) {
LAB_00141490:
            psStack_1f8 = (secp256k1_fe *)0x141495;
            secp256k1_modinv64_update_de_62_cold_23();
            goto LAB_0014149b;
          }
        }
        bVar41 = CARRY8((ulong)psVar29,uVar8);
        psVar29 = (secp256k1_fe *)((long)psVar29->n + uVar8);
        psVar21 = (secp256k1_fe *)((long)psVar21->n + (ulong)bVar41 + lVar40);
        psVar35 = (secp256k1_fe *)psStack_1d0->n[1];
        psVar17 = psStack_1d0;
        if (psVar35 == (secp256k1_fe *)0x0) goto LAB_0014149b;
        psVar12 = (secp256k1_fe *)((long)psVar35 * uVar30);
        psVar25 = SUB168(SEXT816((long)psVar35) * SEXT816((long)uVar30),8);
        if ((long)psVar25 < 0) goto LAB_00141a35;
        uVar8 = (ulong)((secp256k1_fe *)(-(long)psVar12 - 1U) < psVar33);
        lVar40 = (0x7fffffffffffffff - (long)psVar25) - (long)psVar5;
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar25,(long)psVar5) != SBORROW8(lVar40,uVar8)) !=
            (long)(lVar40 - uVar8) < 0) goto LAB_00141a57;
LAB_001413ce:
        bVar41 = CARRY8((ulong)psVar12,(ulong)psVar33);
        psVar12 = (secp256k1_fe *)((long)psVar33->n + (long)psVar12->n);
        psVar25 = (secp256k1_fe *)((long)psVar5->n + (ulong)bVar41 + (long)psVar25->n);
        uVar8 = (long)psVar35 * (long)psVar18;
        lVar40 = SUB168(SEXT816((long)psVar35) * SEXT816((long)psVar18),8);
        if (lVar40 < 0) goto LAB_00141a5c;
        psVar5 = (secp256k1_fe *)(-1 - uVar8);
        lVar22 = ((long)a_01 - lVar40) - (long)psVar21;
        psVar33 = (secp256k1_fe *)(lVar22 - (ulong)(psVar5 < psVar29));
        if ((SBORROW8((long)a_01 - lVar40,(long)psVar21) !=
            SBORROW8(lVar22,(ulong)(psVar5 < psVar29))) != (long)psVar33 < 0) goto LAB_00141a7e;
LAB_001413ff:
        bVar41 = CARRY8((ulong)psVar29,uVar8);
        psVar29 = (secp256k1_fe *)((long)psVar29->n + uVar8);
        psVar21 = (secp256k1_fe *)((long)psVar21->n + (ulong)bVar41 + lVar40);
        psVar5 = psVar25;
        psVar33 = psVar12;
LAB_0014149b:
        psVar25 = psStack_1b0;
        uVar8 = (long)psVar5 << 2 | (ulong)psVar33 >> 0x3e;
        psVar32 = (secp256k1_fe *)(uStack_1e0 * uStack_1a0 + uVar8);
        psVar35 = (secp256k1_fe *)
                  (SUB168(SEXT816((long)uStack_1e0) * SEXT816((long)uStack_1a0),8) +
                   ((long)psVar5 >> 0x3e) + (ulong)CARRY8(uStack_1e0 * uStack_1a0,uVar8));
        psStack_1b0->n[0] = (ulong)psVar33 & 0x3fffffffffffffff;
        uVar8 = (long)psStack_1d8 * uStack_190;
        lVar40 = SUB168(SEXT816((long)psStack_1d8) * SEXT816((long)uStack_190),8);
        psStack_1c8->n[0] = (ulong)psVar29 & 0x3fffffffffffffff;
        if (lVar40 < 0) {
          psVar33 = (secp256k1_fe *)((-0x8000000000000000 - lVar40) - (ulong)(uVar8 != 0));
          psVar5 = (secp256k1_fe *)
                   (((long)psVar35 - (long)psVar33) - (ulong)(psVar32 < (secp256k1_fe *)-uVar8));
          if ((SBORROW8((long)psVar35,(long)psVar33) !=
              SBORROW8((long)psVar35 - (long)psVar33,(ulong)(psVar32 < (secp256k1_fe *)-uVar8))) !=
              (long)psVar5 < 0) goto LAB_001415f9;
LAB_00141509:
          uVar9 = (ulong)psVar29 >> 0x3e | (long)psVar21 << 2;
          bVar41 = CARRY8((ulong)psVar32,uVar8);
          psVar32 = (secp256k1_fe *)((long)psVar32->n + uVar8);
          psVar35 = (secp256k1_fe *)((long)psVar35->n + (ulong)bVar41 + lVar40);
          psVar33 = (secp256k1_fe *)(uStack_1f0 * uStack_1a0 + uVar9);
          psVar5 = (secp256k1_fe *)
                   (SUB168(SEXT816((long)uStack_1f0) * SEXT816((long)uStack_1a0),8) +
                    ((long)psVar21 >> 0x3e) + (ulong)CARRY8(uStack_1f0 * uStack_1a0,uVar9));
          uVar8 = (long)psStack_1e8 * uStack_190;
          lVar40 = SUB168(SEXT816((long)psStack_1e8) * SEXT816((long)uStack_190),8);
          if (lVar40 < 0) goto LAB_001415fe;
          uVar9 = (ulong)((secp256k1_fe *)(-1 - uVar8) < psVar33);
          lVar22 = ((long)a_01 - lVar40) - (long)psVar5;
          if ((SBORROW8((long)a_01 - lVar40,(long)psVar5) != SBORROW8(lVar22,uVar9)) !=
              (long)(lVar22 - uVar9) < 0) goto LAB_00141620;
        }
        else {
          psVar5 = (secp256k1_fe *)(-1 - uVar8);
          lVar22 = ((long)a_01 - lVar40) - (long)psVar35;
          psVar33 = (secp256k1_fe *)(lVar22 - (ulong)(psVar5 < psVar32));
          if ((SBORROW8((long)a_01 - lVar40,(long)psVar35) !=
              SBORROW8(lVar22,(ulong)(psVar5 < psVar32))) == (long)psVar33 < 0) goto LAB_00141509;
LAB_001415f9:
          psStack_1f8 = (secp256k1_fe *)0x1415fe;
          secp256k1_modinv64_update_de_62_cold_22();
          uVar8 = extraout_RAX_01;
          lVar40 = extraout_RDX_02;
LAB_001415fe:
          lVar23 = (-0x8000000000000000 - lVar40) - (ulong)(uVar8 != 0);
          lVar22 = (long)psVar5 - lVar23;
          if ((SBORROW8((long)psVar5,lVar23) !=
              SBORROW8(lVar22,(ulong)(psVar33 < (secp256k1_fe *)-uVar8))) !=
              (long)(lVar22 - (ulong)(psVar33 < (secp256k1_fe *)-uVar8)) < 0) {
LAB_00141620:
            psStack_1f8 = (secp256k1_fe *)0x141625;
            secp256k1_modinv64_update_de_62_cold_21();
            goto LAB_0014162b;
          }
        }
        bVar41 = CARRY8((ulong)psVar33,uVar8);
        psVar33 = (secp256k1_fe *)((long)psVar33->n + uVar8);
        psVar5 = (secp256k1_fe *)((long)psVar5->n + (ulong)bVar41 + lVar40);
        psVar12 = (secp256k1_fe *)psVar17->n[2];
        if (psVar12 == (secp256k1_fe *)0x0) goto LAB_0014162b;
        psVar21 = (secp256k1_fe *)((long)psVar12 * uVar30);
        psVar29 = SUB168(SEXT816((long)psVar12) * SEXT816((long)uVar30),8);
        if ((long)psVar29 < 0) goto LAB_00141a83;
        uVar8 = (ulong)((secp256k1_fe *)(-(long)psVar21 - 1U) < psVar32);
        lVar40 = ((long)a_01 - (long)psVar29) - (long)psVar35;
        psVar37 = psVar32;
        if ((SBORROW8((long)a_01 - (long)psVar29,(long)psVar35) != SBORROW8(lVar40,uVar8)) !=
            (long)(lVar40 - uVar8) < 0) goto LAB_00141aa5;
LAB_0014159e:
        bVar41 = CARRY8((ulong)psVar21,(ulong)psVar37);
        psVar21 = (secp256k1_fe *)((long)psVar37->n + (long)psVar21->n);
        psVar29 = (secp256k1_fe *)((long)psVar35->n + (ulong)bVar41 + (long)psVar29->n);
        uVar8 = (long)psVar12 * (long)psVar18;
        lVar40 = SUB168(SEXT816((long)psVar12) * SEXT816((long)psVar18),8);
        if (lVar40 < 0) goto LAB_00141aaa;
        psVar36 = (secp256k1_fe *)(-1 - uVar8);
        lVar22 = ((long)a_01 - lVar40) - (long)psVar5;
        psVar17 = (secp256k1_fe *)(lVar22 - (ulong)(psVar36 < psVar33));
        psVar32 = psVar21;
        psVar35 = psVar29;
        if ((SBORROW8((long)a_01 - lVar40,(long)psVar5) !=
            SBORROW8(lVar22,(ulong)(psVar36 < psVar33))) != (long)psVar17 < 0) goto LAB_00141acc;
LAB_001415cf:
        bVar41 = CARRY8((ulong)psVar33,uVar8);
        psVar33 = (secp256k1_fe *)((long)psVar33->n + uVar8);
        psVar5 = (secp256k1_fe *)((long)psVar5->n + (ulong)bVar41 + lVar40);
LAB_0014162b:
        uVar8 = (long)psVar35 << 2 | (ulong)psVar32 >> 0x3e;
        psVar37 = (secp256k1_fe *)(uStack_1e0 * uStack_1a8 + uVar8);
        psVar36 = (secp256k1_fe *)
                  (SUB168(SEXT816((long)uStack_1e0) * SEXT816((long)uStack_1a8),8) +
                   ((long)psVar35 >> 0x3e) + (ulong)CARRY8(uStack_1e0 * uStack_1a8,uVar8));
        psVar25->n[1] = (ulong)psVar32 & 0x3fffffffffffffff;
        uVar8 = (long)psStack_1d8 * uStack_188;
        lVar40 = SUB168(SEXT816((long)psStack_1d8) * SEXT816((long)uStack_188),8);
        psStack_1c8->n[1] = (ulong)psVar33 & 0x3fffffffffffffff;
        if (lVar40 < 0) {
          uVar9 = (-0x8000000000000000 - lVar40) - (ulong)(uVar8 != 0);
          psVar21 = (secp256k1_fe *)
                    (((long)psVar36 - uVar9) - (ulong)(psVar37 < (secp256k1_fe *)-uVar8));
          if ((SBORROW8((long)psVar36,uVar9) !=
              SBORROW8((long)psVar36 - uVar9,(ulong)(psVar37 < (secp256k1_fe *)-uVar8))) !=
              (long)psVar21 < 0) goto LAB_00141701;
LAB_00141697:
          uVar10 = (ulong)psVar33 >> 0x3e | (long)psVar5 << 2;
          bVar41 = CARRY8((ulong)psVar37,uVar8);
          psVar37 = (secp256k1_fe *)((long)psVar37->n + uVar8);
          psVar36 = (secp256k1_fe *)((long)psVar36->n + (ulong)bVar41 + lVar40);
          uVar9 = uStack_1f0 * uStack_1a8 + uVar10;
          psVar21 = (secp256k1_fe *)
                    (SUB168(SEXT816((long)uStack_1f0) * SEXT816((long)uStack_1a8),8) +
                     ((long)psVar5 >> 0x3e) + (ulong)CARRY8(uStack_1f0 * uStack_1a8,uVar10));
          uVar8 = (long)psStack_1e8 * uStack_188;
          lVar40 = SUB168(SEXT816((long)psStack_1e8) * SEXT816((long)uStack_188),8);
          if (lVar40 < 0) goto LAB_00141706;
          uVar10 = (ulong)(-uVar8 - 1 < uVar9);
          lVar22 = ((long)a_01 - lVar40) - (long)psVar21;
          bVar41 = SBORROW8((long)a_01 - lVar40,(long)psVar21) != SBORROW8(lVar22,uVar10);
          lVar22 = lVar22 - uVar10;
        }
        else {
          psVar21 = (secp256k1_fe *)(-1 - uVar8);
          lVar22 = ((long)a_01 - lVar40) - (long)psVar36;
          uVar9 = lVar22 - (ulong)(psVar21 < psVar37);
          if ((SBORROW8((long)a_01 - lVar40,(long)psVar36) !=
              SBORROW8(lVar22,(ulong)(psVar21 < psVar37))) == (long)uVar9 < 0) goto LAB_00141697;
LAB_00141701:
          psStack_1f8 = (secp256k1_fe *)0x141706;
          secp256k1_modinv64_update_de_62_cold_20();
          uVar8 = extraout_RAX_02;
          lVar40 = extraout_RDX_03;
LAB_00141706:
          lVar23 = (-0x8000000000000000 - lVar40) - (ulong)(uVar8 != 0);
          lVar22 = (long)psVar21 - lVar23;
          bVar41 = SBORROW8((long)psVar21,lVar23) != SBORROW8(lVar22,(ulong)(uVar9 < -uVar8));
          lVar22 = lVar22 - (ulong)(uVar9 < -uVar8);
        }
        psVar17 = (secp256k1_fe *)0x8000000000000000;
        if (bVar41 != lVar22 < 0) goto LAB_00141b47;
        psVar29 = (secp256k1_fe *)(uVar9 + uVar8);
        psVar21 = (secp256k1_fe *)((long)psVar21->n + (ulong)CARRY8(uVar9,uVar8) + lVar40);
        psVar5 = (secp256k1_fe *)psStack_1d0->n[3];
        if (psVar5 == (secp256k1_fe *)0x0) goto LAB_001417a5;
        psVar12 = (secp256k1_fe *)((long)psVar5 * uVar30);
        psVar25 = SUB168(SEXT816((long)psVar5) * SEXT816((long)uVar30),8);
        if ((long)psVar25 < 0) goto LAB_00141ad1;
        uVar8 = (ulong)((secp256k1_fe *)(-(long)psVar12 - 1U) < psVar37);
        lVar40 = ((long)a_01 - (long)psVar25) - (long)psVar36;
        if ((SBORROW8((long)a_01 - (long)psVar25,(long)psVar36) != SBORROW8(lVar40,uVar8)) !=
            (long)(lVar40 - uVar8) < 0) goto LAB_00141af3;
LAB_00141766:
        bVar41 = CARRY8((ulong)psVar12,(ulong)psVar37);
        psVar12 = (secp256k1_fe *)((long)psVar37->n + (long)psVar12->n);
        psVar25 = (secp256k1_fe *)((long)psVar36->n + (ulong)bVar41 + (long)psVar25->n);
        uVar8 = (long)psVar5 * (long)psVar18;
        lVar40 = SUB168(SEXT816((long)psVar5) * SEXT816((long)psVar18),8);
        if (lVar40 < 0) goto LAB_00141af8;
        uVar9 = (ulong)((secp256k1_fe *)(-1 - uVar8) < psVar29);
        lVar22 = ((long)a_01 - lVar40) - (long)psVar21;
        psVar36 = psVar25;
        psVar37 = psVar12;
        if ((SBORROW8((long)a_01 - lVar40,(long)psVar21) != SBORROW8(lVar22,uVar9)) ==
            (long)(lVar22 - uVar9) < 0) {
          do {
            bVar41 = CARRY8((ulong)psVar29,uVar8);
            psVar29 = (secp256k1_fe *)((long)psVar29->n + uVar8);
            psVar21 = (secp256k1_fe *)((long)psVar21->n + (ulong)bVar41 + lVar40);
LAB_001417a5:
            psVar32 = psStack_1b0;
            uVar8 = (long)psVar36 << 2 | (ulong)psVar37 >> 0x3e;
            psVar37 = (secp256k1_fe *)((ulong)psVar37 & 0x3fffffffffffffff);
            psVar33 = (secp256k1_fe *)(uStack_1e0 * uStack_1b8 + uVar8);
            psVar5 = (secp256k1_fe *)
                     (SUB168(SEXT816((long)uStack_1e0) * SEXT816((long)uStack_1b8),8) +
                      ((long)psVar36 >> 0x3e) + (ulong)CARRY8(uStack_1e0 * uStack_1b8,uVar8));
            psStack_1b0->n[2] = (uint64_t)psVar37;
            uVar8 = (long)psStack_1d8 * uStack_1c0;
            lVar40 = SUB168(SEXT816((long)psStack_1d8) * SEXT816((long)uStack_1c0),8);
            psStack_1c8->n[2] = (ulong)psVar29 & 0x3fffffffffffffff;
            if (lVar40 < 0) {
              lVar23 = (-0x8000000000000000 - lVar40) - (ulong)(uVar8 != 0);
              lVar22 = (long)psVar5 - lVar23;
              psVar35 = (secp256k1_fe *)(lVar22 - (ulong)(psVar33 < (secp256k1_fe *)-uVar8));
              if ((SBORROW8((long)psVar5,lVar23) !=
                  SBORROW8(lVar22,(ulong)(psVar33 < (secp256k1_fe *)-uVar8))) != (long)psVar35 < 0)
              goto LAB_0014187f;
LAB_00141813:
              uVar9 = (ulong)psVar29 >> 0x3e | (long)psVar21 << 2;
              bVar41 = CARRY8((ulong)psVar33,uVar8);
              psVar33 = (secp256k1_fe *)((long)psVar33->n + uVar8);
              psVar5 = (secp256k1_fe *)((long)psVar5->n + (ulong)bVar41 + lVar40);
              psVar37 = (secp256k1_fe *)(uStack_1f0 * uStack_1b8 + uVar9);
              psVar35 = (secp256k1_fe *)
                        (SUB168(SEXT816((long)uStack_1f0) * SEXT816((long)uStack_1b8),8) +
                         ((long)psVar21 >> 0x3e) + (ulong)CARRY8(uStack_1f0 * uStack_1b8,uVar9));
              uVar8 = (long)psStack_1e8 * uStack_1c0;
              lVar40 = SUB168(SEXT816((long)psStack_1e8) * SEXT816((long)uStack_1c0),8);
              if (lVar40 < 0) goto LAB_00141884;
              psVar21 = (secp256k1_fe *)(-1 - uVar8);
              lVar22 = ((long)a_01 - lVar40) - (long)psVar35;
              bVar41 = SBORROW8((long)a_01 - lVar40,(long)psVar35) !=
                       SBORROW8(lVar22,(ulong)(psVar21 < psVar37));
              psVar29 = (secp256k1_fe *)(lVar22 - (ulong)(psVar21 < psVar37));
            }
            else {
              psVar35 = (secp256k1_fe *)(-1 - uVar8);
              lVar22 = ((long)a_01 - lVar40) - (long)psVar5;
              if ((SBORROW8((long)a_01 - lVar40,(long)psVar5) !=
                  SBORROW8(lVar22,(ulong)(psVar35 < psVar33))) ==
                  (long)(lVar22 - (ulong)(psVar35 < psVar33)) < 0) goto LAB_00141813;
LAB_0014187f:
              psStack_1f8 = (secp256k1_fe *)0x141884;
              secp256k1_modinv64_update_de_62_cold_18();
              uVar8 = extraout_RAX_03;
              lVar40 = extraout_RDX_04;
LAB_00141884:
              lVar23 = (-0x8000000000000000 - lVar40) - (ulong)(uVar8 != 0);
              lVar22 = (long)psVar35 - lVar23;
              bVar41 = SBORROW8((long)psVar35,lVar23) !=
                       SBORROW8(lVar22,(ulong)(psVar37 < (secp256k1_fe *)-uVar8));
              psVar21 = (secp256k1_fe *)(lVar22 - (ulong)(psVar37 < (secp256k1_fe *)-uVar8));
              psVar29 = psVar21;
            }
            psVar17 = psStack_1d0;
            psVar25 = (secp256k1_fe *)0x8000000000000000;
            if (bVar41 != (long)psVar29 < 0) goto LAB_00141b4c;
            psVar12 = (secp256k1_fe *)((long)psVar37->n + uVar8);
            psVar35 = (secp256k1_fe *)
                      ((long)psVar35->n + (ulong)CARRY8((ulong)psVar37,uVar8) + lVar40);
            psVar29 = (secp256k1_fe *)psStack_1d0->n[4];
            psVar21 = (secp256k1_fe *)((long)psVar29 * uVar30);
            uVar30 = SUB168(SEXT816((long)psVar29) * SEXT816((long)uVar30),8);
            if ((long)uVar30 < 0) {
              lVar22 = (-0x8000000000000000 - uVar30) - (ulong)(psVar21 != (secp256k1_fe *)0x0);
              lVar40 = (long)psVar5 - lVar22;
              if ((SBORROW8((long)psVar5,lVar22) !=
                  SBORROW8(lVar40,(ulong)(psVar33 < (secp256k1_fe *)-(long)psVar21))) !=
                  (long)(lVar40 - (ulong)(psVar33 < (secp256k1_fe *)-(long)psVar21)) < 0)
              goto LAB_00141a10;
LAB_001418df:
              bVar41 = CARRY8((ulong)psVar21,(ulong)psVar33);
              psVar21 = (secp256k1_fe *)((long)psVar33->n + (long)psVar21->n);
              uVar30 = (long)psVar5->n + bVar41 + uVar30;
              uVar8 = (long)psVar29 * (long)psVar18;
              lVar40 = SUB168(SEXT816((long)psVar29) * SEXT816((long)psVar18),8);
              if (lVar40 < 0) goto LAB_00141a15;
              psVar18 = (secp256k1_fe *)(-uVar8 - 1);
              lVar22 = (long)a_01 - lVar40;
              lVar23 = lVar22 - (long)psVar35;
              a_01 = (secp256k1_fe *)(lVar23 - (ulong)(psVar18 < psVar12));
              if ((SBORROW8(lVar22,(long)psVar35) != SBORROW8(lVar23,(ulong)(psVar18 < psVar12))) ==
                  (long)a_01 < 0) goto LAB_0014190d;
            }
            else {
              uVar8 = (ulong)((secp256k1_fe *)(-(long)psVar21 - 1U) < psVar33);
              lVar40 = ((long)a_01 - uVar30) - (long)psVar5;
              if ((SBORROW8((long)a_01 - uVar30,(long)psVar5) != SBORROW8(lVar40,uVar8)) ==
                  (long)(lVar40 - uVar8) < 0) goto LAB_001418df;
LAB_00141a10:
              psStack_1f8 = (secp256k1_fe *)0x141a15;
              secp256k1_modinv64_update_de_62_cold_16();
              uVar8 = extraout_RAX_04;
              lVar40 = extraout_RDX_05;
LAB_00141a15:
              psVar5 = (secp256k1_fe *)((-0x8000000000000000 - lVar40) - (ulong)(uVar8 != 0));
              psVar18 = (secp256k1_fe *)
                        (((long)psVar35 - (long)psVar5) - (ulong)(psVar12 < (secp256k1_fe *)-uVar8))
              ;
              if ((SBORROW8((long)psVar35,(long)psVar5) !=
                  SBORROW8((long)psVar35 - (long)psVar5,(ulong)(psVar12 < (secp256k1_fe *)-uVar8)))
                  == (long)psVar18 < 0) {
LAB_0014190d:
                a_01 = psStack_1c8;
                uVar9 = (long)psVar12->n + uVar8;
                lVar40 = (long)psVar35->n + (ulong)CARRY8(uVar8,(ulong)psVar12) + lVar40;
                psVar18 = (secp256k1_fe *)(uVar30 << 2 | (ulong)psVar21 >> 0x3e);
                psVar32->n[3] = (ulong)psVar21 & 0x3fffffffffffffff;
                psVar28 = (secp256k1_fe *)(uVar9 & 0x3fffffffffffffff);
                psStack_1c8->n[3] = (uint64_t)psVar28;
                psVar21 = (secp256k1_fe *)(psVar18[0x2aaaaaaaaaaaaaa].n + 2);
                uVar30 = ((long)uVar30 >> 0x3e) + -1 +
                         (ulong)((secp256k1_fe *)0x7fffffffffffffff < psVar18);
                if (uVar30 != 0xffffffffffffffff) goto LAB_00141b51;
                uVar30 = 0xffffffffffffffff;
                uVar8 = uVar9 >> 0x3e | lVar40 * 4;
                psVar32->n[4] = (uint64_t)psVar18;
                if ((lVar40 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar8) != -1)
                goto LAB_00141b56;
                psStack_1c8->n[4] = uVar8;
                uVar30 = 5;
                psVar18 = (secp256k1_fe *)0xfffffffffffffffe;
                psStack_1f8 = (secp256k1_fe *)0x141985;
                psVar21 = psVar32;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)psVar32,5,
                                   (secp256k1_modinv64_signed62 *)psVar17,-2);
                if (iVar4 < 1) goto LAB_00141b5b;
                psVar18 = (secp256k1_fe *)0x1;
                uVar30 = 5;
                psStack_1f8 = (secp256k1_fe *)0x1419a2;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)psVar32,5,
                                   (secp256k1_modinv64_signed62 *)psVar17,1);
                if (-1 < iVar4) goto LAB_00141b60;
                uVar30 = 5;
                psVar18 = (secp256k1_fe *)0xfffffffffffffffe;
                psStack_1f8 = (secp256k1_fe *)0x1419c1;
                psVar32 = a_01;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_01,5,
                                   (secp256k1_modinv64_signed62 *)psVar17,-2);
                if (iVar4 < 1) goto LAB_00141b65;
                psVar18 = (secp256k1_fe *)0x1;
                uVar30 = 5;
                psStack_1f8 = (secp256k1_fe *)0x1419de;
                psVar32 = a_01;
                iVar4 = secp256k1_modinv64_mul_cmp_62
                                  ((secp256k1_modinv64_signed62 *)a_01,5,
                                   (secp256k1_modinv64_signed62 *)psVar17,1);
                if (iVar4 < 0) {
                  return;
                }
                goto LAB_00141b6a;
              }
            }
            psStack_1f8 = (secp256k1_fe *)0x141a35;
            secp256k1_modinv64_update_de_62_cold_15();
LAB_00141a35:
            lVar22 = (-0x8000000000000000 - (long)psVar25) - (ulong)(psVar12 != (secp256k1_fe *)0x0)
            ;
            lVar40 = (long)psVar5 - lVar22;
            if ((SBORROW8((long)psVar5,lVar22) !=
                SBORROW8(lVar40,(ulong)(psVar33 < (secp256k1_fe *)-(long)psVar12))) ==
                (long)(lVar40 - (ulong)(psVar33 < (secp256k1_fe *)-(long)psVar12)) < 0)
            goto LAB_001413ce;
LAB_00141a57:
            psStack_1f8 = (secp256k1_fe *)0x141a5c;
            secp256k1_modinv64_update_de_62_cold_4();
            uVar8 = extraout_RAX_05;
            lVar40 = extraout_RDX_06;
LAB_00141a5c:
            psVar33 = (secp256k1_fe *)((-0x8000000000000000 - lVar40) - (ulong)(uVar8 != 0));
            psVar5 = (secp256k1_fe *)
                     (((long)psVar21 - (long)psVar33) - (ulong)(psVar29 < (secp256k1_fe *)-uVar8));
            if ((SBORROW8((long)psVar21,(long)psVar33) !=
                SBORROW8((long)psVar21 - (long)psVar33,(ulong)(psVar29 < (secp256k1_fe *)-uVar8)))
                == (long)psVar5 < 0) goto LAB_001413ff;
LAB_00141a7e:
            psStack_1f8 = (secp256k1_fe *)0x141a83;
            secp256k1_modinv64_update_de_62_cold_3();
LAB_00141a83:
            lVar22 = (-0x8000000000000000 - (long)psVar29) - (ulong)(psVar21 != (secp256k1_fe *)0x0)
            ;
            lVar40 = (long)psVar35 - lVar22;
            psVar37 = psVar32;
            if ((SBORROW8((long)psVar35,lVar22) !=
                SBORROW8(lVar40,(ulong)(psVar32 < (secp256k1_fe *)-(long)psVar21))) ==
                (long)(lVar40 - (ulong)(psVar32 < (secp256k1_fe *)-(long)psVar21)) < 0)
            goto LAB_0014159e;
LAB_00141aa5:
            psStack_1f8 = (secp256k1_fe *)0x141aaa;
            secp256k1_modinv64_update_de_62_cold_6();
            uVar8 = extraout_RAX_06;
            lVar40 = extraout_RDX_07;
            psVar37 = psVar32;
LAB_00141aaa:
            psVar17 = (secp256k1_fe *)((-0x8000000000000000 - lVar40) - (ulong)(uVar8 != 0));
            psVar36 = (secp256k1_fe *)
                      (((long)psVar5 - (long)psVar17) - (ulong)(psVar33 < (secp256k1_fe *)-uVar8));
            psVar32 = psVar21;
            psVar35 = psVar29;
            if ((SBORROW8((long)psVar5,(long)psVar17) !=
                SBORROW8((long)psVar5 - (long)psVar17,(ulong)(psVar33 < (secp256k1_fe *)-uVar8))) ==
                (long)psVar36 < 0) goto LAB_001415cf;
LAB_00141acc:
            psStack_1f8 = (secp256k1_fe *)0x141ad1;
            secp256k1_modinv64_update_de_62_cold_5();
LAB_00141ad1:
            lVar22 = (-0x8000000000000000 - (long)psVar25) - (ulong)(psVar12 != (secp256k1_fe *)0x0)
            ;
            lVar40 = (long)psVar36 - lVar22;
            if ((SBORROW8((long)psVar36,lVar22) !=
                SBORROW8(lVar40,(ulong)(psVar37 < (secp256k1_fe *)-(long)psVar12))) ==
                (long)(lVar40 - (ulong)(psVar37 < (secp256k1_fe *)-(long)psVar12)) < 0)
            goto LAB_00141766;
LAB_00141af3:
            psStack_1f8 = (secp256k1_fe *)0x141af8;
            secp256k1_modinv64_update_de_62_cold_8();
            uVar8 = extraout_RAX_07;
            lVar40 = extraout_RDX_08;
LAB_00141af8:
            lVar23 = (-0x8000000000000000 - lVar40) - (ulong)(uVar8 != 0);
            lVar22 = (long)psVar21 - lVar23;
            psVar36 = psVar25;
            psVar37 = psVar12;
            if ((SBORROW8((long)psVar21,lVar23) !=
                SBORROW8(lVar22,(ulong)(psVar29 < (secp256k1_fe *)-uVar8))) !=
                (long)(lVar22 - (ulong)(psVar29 < (secp256k1_fe *)-uVar8)) < 0) break;
          } while( true );
        }
        psStack_1f8 = (secp256k1_fe *)0x141b1f;
        secp256k1_modinv64_update_de_62_cold_7();
        goto LAB_00141b1f;
      }
      lVar23 = (-0x8000000000000000 - (long)psVar32) - (ulong)(puVar11 != (uint64_t *)0x0);
      lVar40 = (long)psVar21 - lVar23;
      if ((SBORROW8((long)psVar21,lVar23) !=
          SBORROW8(lVar40,(ulong)(psVar5 < (secp256k1_fe *)-(long)puVar11))) !=
          (long)(lVar40 - (ulong)(psVar5 < (secp256k1_fe *)-(long)puVar11)) < 0) goto LAB_00141422;
LAB_00141261:
      psVar29 = (secp256k1_fe *)((ulong)psVar29 & uStack_1f0);
      psVar18 = (secp256k1_fe *)
                ((long)psVar29 +
                (((ulong)psVar18 & (ulong)psStack_1e8) -
                ((long)psVar29->n + uVar8 * (long)psVar33 + ((ulong)psVar18 & (ulong)psStack_1e8) &
                0x3fffffffffffffff)));
      bVar41 = CARRY8((ulong)puVar11,(ulong)psVar5);
      puVar11 = (uint64_t *)((long)psVar5->n + (long)puVar11);
      psVar32 = (secp256k1_fe *)((long)psVar21->n + (ulong)bVar41 + (long)psVar32->n);
      uVar8 = (long)psVar18 * uVar24;
      uVar24 = SUB168(SEXT816((long)psVar18) * SEXT816((long)uVar24),8);
      if ((long)uVar24 < 0) goto LAB_00141427;
      uVar9 = (ulong)((secp256k1_fe *)(-uVar8 - 1) < psVar33);
      lVar40 = (0x7fffffffffffffff - uVar24) - lVar22;
      if ((SBORROW8(0x7fffffffffffffff - uVar24,lVar22) != SBORROW8(lVar40,uVar9)) !=
          (long)(lVar40 - uVar9) < 0) goto LAB_00141449;
LAB_001412b1:
      bVar41 = CARRY8(uVar8,(ulong)psVar33);
      uVar8 = (long)psVar33->n + uVar8;
      uVar24 = uVar24 + lVar22 + (ulong)bVar41;
      if (((ulong)puVar11 & 0x3fffffffffffffff) != 0) goto LAB_00141b3d;
      psVar17 = psVar29;
      if ((uVar8 & 0x3fffffffffffffff) == 0) {
        uVar9 = (ulong)puVar11 >> 0x3e | (long)psVar32 << 2;
        psVar33 = (secp256k1_fe *)(uStack_1e0 * uStack_198 + uVar9);
        psVar5 = (secp256k1_fe *)
                 (SUB168(SEXT816((long)uStack_1e0) * SEXT816((long)uStack_198),8) +
                  ((long)psVar32 >> 0x3e) + (ulong)CARRY8(uStack_1e0 * uStack_198,uVar9));
        uVar9 = (long)psStack_1d8 * (long)psStack_180;
        lVar40 = SUB168(SEXT816((long)psStack_1d8) * SEXT816((long)psStack_180),8);
        psVar32 = psStack_180;
        if (lVar40 < 0) goto LAB_0014144e;
        psVar21 = (secp256k1_fe *)(-1 - uVar9);
        lVar22 = (0x7fffffffffffffff - lVar40) - (long)psVar5;
        psVar29 = (secp256k1_fe *)(lVar22 - (ulong)(psVar21 < psVar33));
        if ((SBORROW8(0x7fffffffffffffff - lVar40,(long)psVar5) !=
            SBORROW8(lVar22,(ulong)(psVar21 < psVar33))) != (long)psVar29 < 0) goto LAB_00141473;
        goto LAB_00141334;
      }
      goto LAB_00141b42;
    }
  }
  iVar4 = (int)uVar30;
  psStack_1f8 = (secp256k1_fe *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_27();
  a_02 = &sStack_258;
  psStack_208 = psVar28;
  psStack_200 = a_01;
  psStack_1f8 = psVar17;
  secp256k1_modinv64_mul_62(&sStack_230,(secp256k1_modinv64_signed62 *)psVar21,iVar4,1);
  psVar31 = a_00;
  secp256k1_modinv64_mul_62(&sStack_258,a_00,5,(int64_t)psVar18);
  lVar40 = 0;
  while ((ulong)sStack_230.v[lVar40] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_258.v[lVar40]) goto LAB_00141c09;
    lVar40 = lVar40 + 1;
    if (lVar40 == 4) {
      uVar20 = 4;
      while( true ) {
        if (sStack_230.v[uVar20] < sStack_258.v[uVar20]) {
          return;
        }
        if (sStack_258.v[uVar20] < sStack_230.v[uVar20]) break;
        bVar41 = uVar20 == 0;
        uVar20 = uVar20 - 1;
        if (bVar41) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00141c09:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  iVar4 = (int)a_02;
  if (iVar4 < 1) {
LAB_00141eb6:
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_00141ebb:
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_00141ec0:
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_00141ec5:
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_00141eca:
    secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_00141ecf:
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    uVar24 = psVar18->n[0];
    uVar1 = psVar18->n[1];
    lVar40 = psVar31->v[0];
    lVar22 = *extraout_RDX_09;
    uVar30 = lVar40 * uVar24;
    lVar26 = SUB168(SEXT816(lVar40) * SEXT816((long)uVar24),8);
    uVar8 = lVar22 * uVar1;
    lVar27 = SUB168(SEXT816(lVar22) * SEXT816((long)uVar1),8);
    lVar23 = (0x7fffffffffffffff - lVar27) - lVar26;
    if ((SBORROW8(0x7fffffffffffffff - lVar27,lVar26) != SBORROW8(lVar23,(ulong)(~uVar8 < uVar30)))
        != (long)(lVar23 - (ulong)(~uVar8 < uVar30)) < 0 && -1 < lVar27) goto LAB_00141ecf;
    uVar2 = psVar18->n[2];
    uVar3 = psVar18->n[3];
    lVar26 = lVar27 + lVar26 + (ulong)CARRY8(uVar8,uVar30);
    uVar10 = lVar40 * uVar2;
    lVar23 = SUB168(SEXT816(lVar40) * SEXT816((long)uVar2),8);
    uVar13 = lVar22 * uVar3;
    lVar22 = SUB168(SEXT816(lVar22) * SEXT816((long)uVar3),8);
    uVar9 = (ulong)(-uVar13 - 1 < uVar10);
    lVar40 = (0x7fffffffffffffff - lVar22) - lVar23;
    if ((SBORROW8(0x7fffffffffffffff - lVar22,lVar23) != SBORROW8(lVar40,uVar9)) ==
        (long)(lVar40 - uVar9) < 0 || lVar22 < 0) {
      lVar40 = lVar22 + lVar23 + (ulong)CARRY8(uVar13,uVar10);
      if ((uVar8 + uVar30 & 0x3fffffffffffffff) != 0) goto LAB_00141ebb;
      if ((uVar13 + uVar10 & 0x3fffffffffffffff) != 0) goto LAB_00141ec0;
      uVar9 = uVar13 + uVar10 >> 0x3e | lVar40 * 4;
      uVar30 = uVar8 + uVar30 >> 0x3e | lVar26 * 4;
      lVar40 = lVar40 >> 0x3e;
      lVar26 = lVar26 >> 0x3e;
      if (iVar4 != 1) {
        a_02 = (secp256k1_modinv64_signed62 *)((ulong)a_02 & 0xffffffff);
        psVar19 = (secp256k1_modinv64_signed62 *)0x1;
        do {
          lVar22 = psVar31->v[(long)psVar19];
          uVar10 = lVar22 * uVar24 + uVar30;
          lVar27 = SUB168(SEXT816(lVar22) * SEXT816((long)uVar24),8) + lVar26 +
                   (ulong)CARRY8(lVar22 * uVar24,uVar30);
          lVar23 = extraout_RDX_09[(long)psVar19];
          uVar8 = lVar23 * uVar1;
          lVar26 = SUB168(SEXT816(lVar23) * SEXT816((long)uVar1),8);
          if (lVar26 < 0) {
            lVar38 = (-0x8000000000000000 - lVar26) - (ulong)(uVar8 != 0);
            lVar14 = lVar27 - lVar38;
            if ((SBORROW8(lVar27,lVar38) != SBORROW8(lVar14,(ulong)(uVar10 < -uVar8))) ==
                (long)(lVar14 - (ulong)(uVar10 < -uVar8)) < 0) goto LAB_00141da5;
LAB_00141eac:
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_00141eb1:
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_00141eb6;
          }
          uVar30 = (ulong)(-uVar8 - 1 < uVar10);
          lVar14 = (0x7fffffffffffffff - lVar26) - lVar27;
          if ((SBORROW8(0x7fffffffffffffff - lVar26,lVar27) != SBORROW8(lVar14,uVar30)) !=
              (long)(lVar14 - uVar30) < 0) goto LAB_00141eac;
LAB_00141da5:
          lVar26 = lVar27 + lVar26 + (ulong)CARRY8(uVar10,uVar8);
          uVar39 = lVar22 * uVar2 + uVar9;
          lVar22 = SUB168(SEXT816(lVar22) * SEXT816((long)uVar2),8) + lVar40 +
                   (ulong)CARRY8(lVar22 * uVar2,uVar9);
          uVar13 = lVar23 * uVar3;
          lVar40 = SUB168(SEXT816(lVar23) * SEXT816((long)uVar3),8);
          if (lVar40 < 0) {
            lVar27 = (-0x8000000000000000 - lVar40) - (ulong)(uVar13 != 0);
            lVar23 = lVar22 - lVar27;
            if ((SBORROW8(lVar22,lVar27) != SBORROW8(lVar23,(ulong)(uVar39 < -uVar13))) !=
                (long)(lVar23 - (ulong)(uVar39 < -uVar13)) < 0) goto LAB_00141eb1;
          }
          else {
            uVar30 = (ulong)(-uVar13 - 1 < uVar39);
            lVar23 = (0x7fffffffffffffff - lVar40) - lVar22;
            if ((SBORROW8(0x7fffffffffffffff - lVar40,lVar22) != SBORROW8(lVar23,uVar30)) !=
                (long)(lVar23 - uVar30) < 0) goto LAB_00141eb1;
          }
          lVar40 = lVar22 + lVar40 + (ulong)CARRY8(uVar39,uVar13);
          uVar30 = lVar26 * 4 | uVar10 + uVar8 >> 0x3e;
          psVar31->v[(long)((long)psVar19[-1].v + 0x27)] = uVar10 + uVar8 & 0x3fffffffffffffff;
          uVar9 = lVar40 * 4 | uVar39 + uVar13 >> 0x3e;
          extraout_RDX_09[(long)((long)psVar19[-1].v + 0x27)] = uVar39 + uVar13 & 0x3fffffffffffffff
          ;
          psVar19 = (secp256k1_modinv64_signed62 *)((long)psVar19->v + 1);
          lVar40 = lVar40 >> 0x3e;
          lVar26 = lVar26 >> 0x3e;
        } while (a_02 != psVar19);
      }
      if (lVar26 + -1 + (ulong)(0x7fffffffffffffff < uVar30) != -1) goto LAB_00141ec5;
      psVar31->v[(long)iVar4 + -1] = uVar30;
      if (lVar40 + -1 + (ulong)(0x7fffffffffffffff < uVar9) == -1) {
        extraout_RDX_09[(long)iVar4 + -1] = uVar9;
        return;
      }
      goto LAB_00141eca;
    }
  }
  secp256k1_modinv64_update_fg_62_var_cold_7();
  lVar40 = a_02->v[0];
  lVar22 = a_02->v[1];
  lVar23 = a_02->v[2];
  lVar26 = a_02->v[3];
  lVar27 = a_02->v[4];
  lVar14 = 0;
  do {
    if (a_02->v[lVar14] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_00142105:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0014210a;
    }
    if (0x3fffffffffffffff < a_02->v[lVar14]) goto LAB_00142105;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 5);
  iVar4 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,-2);
  if (iVar4 < 1) {
LAB_0014210a:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_0014210f:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_00142114:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar4 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,1);
    if (-1 < iVar4) goto LAB_0014210f;
    uVar30 = lVar27 >> 0x3f;
    uVar10 = (long)psVar31 >> 0x3f;
    uVar8 = ((uVar30 & b->v[0]) + lVar40 ^ uVar10) - uVar10;
    uVar13 = ((long)uVar8 >> 0x3e) + (((uVar30 & b->v[1]) + lVar22 ^ uVar10) - uVar10);
    uVar39 = ((long)uVar13 >> 0x3e) + ((lVar23 + (uVar30 & b->v[2]) ^ uVar10) - uVar10);
    uVar9 = ((long)uVar39 >> 0x3e) + (((uVar30 & b->v[3]) + lVar26 ^ uVar10) - uVar10);
    lVar40 = ((long)uVar9 >> 0x3e) + (((uVar30 & b->v[4]) + lVar27 ^ uVar10) - uVar10);
    uVar10 = lVar40 >> 0x3f;
    uVar30 = (b->v[0] & uVar10) + (uVar8 & 0x3fffffffffffffff);
    uVar13 = ((long)uVar30 >> 0x3e) + (b->v[1] & uVar10) + (uVar13 & 0x3fffffffffffffff);
    uVar8 = ((long)uVar13 >> 0x3e) + (b->v[2] & uVar10) + (uVar39 & 0x3fffffffffffffff);
    uVar9 = ((long)uVar8 >> 0x3e) + (b->v[3] & uVar10) + (uVar9 & 0x3fffffffffffffff);
    uVar10 = (b->v[4] & uVar10) + lVar40 + ((long)uVar9 >> 0x3e);
    a_02->v[0] = uVar30 & 0x3fffffffffffffff;
    a_02->v[1] = uVar13 & 0x3fffffffffffffff;
    a_02->v[2] = uVar8 & 0x3fffffffffffffff;
    a_02->v[3] = uVar9 & 0x3fffffffffffffff;
    a_02->v[4] = uVar10;
    if (0x3fffffffffffffff < uVar10) goto LAB_00142114;
    iVar4 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,0);
    if (-1 < iVar4) {
      iVar4 = secp256k1_modinv64_mul_cmp_62(a_02,5,b,1);
      if (iVar4 < 0) {
        return;
      }
      goto LAB_0014211e;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_0014211e:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_add(secp256k1_fe *r, const secp256k1_fe *a) {
    SECP256K1_FE_VERIFY(r);
    SECP256K1_FE_VERIFY(a);
    VERIFY_CHECK(r->magnitude + a->magnitude <= 32);

    secp256k1_fe_impl_add(r, a);
    r->magnitude += a->magnitude;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}